

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O1

Task * AI::create_Stare(void)

{
  pointer pTVar1;
  Task *in_RDI;
  Task focusPlayer;
  Task bark;
  string local_750;
  string local_730;
  RequiredFlag local_710;
  Task local_708;
  Task local_390;
  
  local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_730,"stare","");
  Task::Task(in_RDI,&local_730,Compound);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730._M_dataplus._M_p != &local_730.field_2) {
    operator_delete(local_730._M_dataplus._M_p,local_730.field_2._M_allocated_capacity + 1);
  }
  local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"focusPlayer","");
  Task::Task(&local_708,&local_750,Simple);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != &local_750.field_2) {
    operator_delete(local_750._M_dataplus._M_p,local_750.field_2._M_allocated_capacity + 1);
  }
  local_708.action = FocusPlayer;
  create_Bark(&local_390,StaringAtPlayer);
  pTVar1 = (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
      super__Vector_impl_data._M_start != pTVar1) {
    pTVar1[-1].isLastInCompound = false;
  }
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back(&in_RDI->subtasks,&local_708);
  pTVar1 = (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar1[-1].isLastInCompound = true;
  pTVar1[-1].isLastInCompound =
       (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
       super__Vector_impl_data._M_start == pTVar1;
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back(&in_RDI->subtasks,&local_390);
  (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].isLastInCompound = true;
  local_710.id = PlayerIdentified;
  local_710.flag = true;
  std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>::emplace_back<AI::RequiredFlag>
            (&(in_RDI->postconditions).requiredFlags,&local_710);
  Task::~Task(&local_390);
  Task::~Task(&local_708);
  return in_RDI;
}

Assistant:

Task create_Stare()
	{
		Task stare {"stare", TaskType::Compound};

		Task focusPlayer {"focusPlayer"};
		focusPlayer.action = Action::FocusPlayer;

		auto bark = create_Bark(Bark::StaringAtPlayer);

		//auto playMontage = create_PlayMontage(Montage::Stare);

		stare.addSubtask(focusPlayer);
		stare.addSubtask(bark);
		//stare.addSubtask(playMontage);

		stare.postconditions.requiredFlags.push_back({WorldStateIdentifier::PlayerIdentified, true});

		return stare;
	}